

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_fragment.cpp
# Opt level: O2

bool __thiscall
ON_SubDMesh::GetFaceCenterPointAndNormal(ON_SubDMesh *this,ON_SubDFace *face,double *P,double *N)

{
  byte bVar1;
  double *pdVar2;
  double *pdVar3;
  double dVar4;
  bool bVar5;
  uint uVar6;
  ON_SubDMeshFragment *this_00;
  long lVar7;
  long lVar8;
  bool bVar9;
  uint uVar10;
  
  dVar4 = ON_DBL_QNAN;
  if (P != (double *)0x0) {
    *P = ON_DBL_QNAN;
    P[1] = dVar4;
    P[2] = dVar4;
  }
  dVar4 = ON_DBL_QNAN;
  if (N != (double *)0x0) {
    *N = ON_DBL_QNAN;
    N[1] = dVar4;
    N[2] = dVar4;
  }
  this_00 = FaceFragment(this,face);
  if ((this_00 == (ON_SubDMeshFragment *)0x0) || (pdVar2 = this_00->m_P, pdVar2 == (double *)0x0)) {
    bVar9 = false;
  }
  else {
    pdVar3 = this_00->m_N;
    bVar9 = false;
    if (pdVar3 != (double *)0x0) {
      bVar1 = (this_00->m_grid).m_side_segment_count;
      bVar5 = ON_SubDMeshFragment::IsFullFaceFragment(this_00);
      uVar10 = (bVar1 + 2) * (uint)bVar1 >> 1;
      if (!bVar5) {
        uVar10 = 0;
      }
      uVar6 = ON_SubDMeshFragment::PointCount(this_00);
      if (uVar10 < uVar6) {
        lVar7 = this_00->m_N_stride * (ulong)uVar10;
        if (P != (double *)0x0) {
          lVar8 = (ulong)uVar10 * this_00->m_P_stride;
          *P = pdVar2[lVar8];
          P[1] = pdVar2[lVar8 + 1];
          P[2] = pdVar2[lVar8 + 2];
        }
        bVar9 = true;
        if (N != (double *)0x0) {
          *N = pdVar3[lVar7];
          N[1] = pdVar3[lVar7 + 1];
          N[2] = pdVar3[lVar7 + 2];
        }
      }
    }
  }
  return bVar9;
}

Assistant:

bool ON_SubDMesh::GetFaceCenterPointAndNormal(
  const class ON_SubDFace* face,
  double* P,
  double* N
) const
{
  if (nullptr != P)
  {
    P[0] = ON_DBL_QNAN;
    P[1] = ON_DBL_QNAN;
    P[2] = ON_DBL_QNAN;
  }
  if (nullptr != N)
  {
    N[0] = ON_DBL_QNAN;
    N[1] = ON_DBL_QNAN;
    N[2] = ON_DBL_QNAN;
  }
  const ON_SubDMeshFragment* fragment = FaceFragment(face);
  if (nullptr == fragment)
    return false;
  if (nullptr == fragment->m_P || nullptr == fragment->m_N)
    return false;
  const unsigned int n = fragment->m_grid.m_side_segment_count;
  const unsigned int P_dex = fragment->IsFullFaceFragment() ? (n*(n + 2) / 2) : 0;
  if (P_dex >= fragment->PointCount())
    return false;
  const double* fragment_P = fragment->m_P + (P_dex * fragment->m_P_stride);
  const double* fragment_N = fragment->m_N + (P_dex * fragment->m_N_stride);
  if (nullptr != P)
  {
    P[0] = fragment_P[0];
    P[1] = fragment_P[1];
    P[2] = fragment_P[2];
  }
  if (nullptr != N)
  {
    N[0] = fragment_N[0];
    N[1] = fragment_N[1];
    N[2] = fragment_N[2];
  }
  return true;
}